

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

void objindx(mcmcxdef *mctx,objnum objn)

{
  uchar *puVar1;
  ushort *puVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint16_t tmp;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  undefined6 in_register_00000032;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  byte *pbVar16;
  byte *__src;
  byte *__dest;
  bool bVar17;
  ushort need;
  ushort local_52;
  ulong local_50;
  ulong local_48;
  mcmcxdef *local_40;
  uchar *local_38;
  
  puVar5 = mcmlck(mctx,objn);
  uVar3 = *(ushort *)(puVar5 + 6);
  uVar15 = (uint)uVar3;
  local_48 = (CONCAT62(in_register_00000032,objn) & 0xffffffff) >> 8;
  local_50 = (ulong)((uint)CONCAT62(in_register_00000032,objn) & 0xff);
  uVar4 = *(ushort *)(puVar5 + 8);
  uVar6 = (uint)*(ushort *)
                 ((long)&mctx->mcmcxgl->mcmcxtab[mctx->mcmcxmtb[local_48][local_50] >> 8]->mcmosiz +
                 (ulong)((mctx->mcmcxmtb[local_48][local_50] & 0xff) << 5)) - (uint)uVar4;
  local_40 = mctx;
  if (uVar6 < (uint)uVar3 * 4 + 2) {
    local_52 = (uVar3 * 4 - (short)uVar6) + 0x2a;
    puVar5 = objexp(mctx,objn,&local_52);
    puVar1 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2;
    uVar4 = *(ushort *)(puVar5 + 8);
  }
  else {
    puVar1 = puVar5 + (ulong)*(ushort *)(puVar5 + 4) * 2;
  }
  pbVar10 = puVar1 + 0xe;
  if (uVar3 != 0) {
    pbVar16 = puVar5 + uVar4;
    iVar9 = 0;
    uVar6 = 0;
    local_38 = puVar5;
    do {
      bVar14 = *pbVar10;
      __dest = pbVar16;
      if (uVar6 != 0) {
        uVar11 = uVar6 - 1;
        uVar13 = 0;
        do {
          uVar12 = uVar13;
          uVar8 = uVar11 - uVar12 >> 1;
          uVar7 = uVar8 + uVar12;
          __dest = pbVar16 + uVar7 * 4;
          bVar17 = pbVar16[uVar7 * 4] < bVar14;
          if ((pbVar16[uVar7 * 4] == bVar14) &&
             (bVar17 = __dest[1] < pbVar10[1], __dest[1] == pbVar10[1])) break;
          if (bVar17) {
            uVar13 = uVar12 + 1;
            if (1 < uVar11 - uVar12) {
              uVar13 = uVar7;
            }
          }
          else {
            bVar17 = uVar7 != uVar11;
            uVar11 = uVar11 - 1;
            uVar13 = uVar12;
            if (bVar17) {
              uVar11 = uVar7;
            }
          }
        } while (uVar13 <= uVar11);
        if (uVar7 < uVar6) {
          uVar11 = iVar9 + (uVar8 + uVar12) * -4;
          __src = __dest;
          do {
            __dest = __src + 4;
            if (bVar14 < *__src) {
              memmove(__dest,__src,(ulong)uVar11);
              bVar14 = *pbVar10;
              puVar5 = local_38;
              __dest = __src;
              break;
            }
            uVar7 = uVar7 + 1;
            uVar11 = uVar11 - 4;
            __src = __dest;
          } while (uVar7 < uVar6);
        }
      }
      *__dest = bVar14;
      __dest[1] = pbVar10[1];
      *(short *)(__dest + 2) = (short)pbVar10 - (short)puVar5;
      pbVar10 = pbVar10 + (ulong)*(ushort *)(pbVar10 + 3) + 6;
      uVar6 = uVar6 + 1;
      iVar9 = iVar9 + 4;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  puVar5[2] = puVar5[2] | 2;
  puVar2 = &local_40->mcmcxgl->mcmcxtab[local_40->mcmcxmtb[local_48][local_50] >> 8]
            [(byte)local_40->mcmcxmtb[local_48][local_50]].mcmoflg;
  *puVar2 = *puVar2 | 1;
  mcmunlck(local_40,objn);
  return;
}

Assistant:

void objindx(mcmcxdef *mctx, objnum objn)
{
    uint    newsiz;
    uint    avail;
    objdef *objptr;
    uint    cnt;
    prpdef *p;
    uchar  *indp;
    uchar  *indbase;
    uint    icnt;
    uint    first;
    uint    last;
    uint    cur;
    
    objptr = (objdef *)mcmlck(mctx, objn);            /* get object pointer */
    cnt = objnprop(objptr);                     /* get number of properties */
    p = objprp(objptr);         /* get pointer to properties (or old index) */
    newsiz = 2 + 4*cnt;                 /* figure size needed for the index */
    
    avail = mcmobjsiz(mctx, objn) - objfree(objptr);
    
    /* insert space for the index; expand the object if necessary */
    if (avail < newsiz)
    {
        ushort  need;
        
        newsiz += 10*4;                   /* add some extra space for later */
        need = newsiz - avail;            /* compute amount of space needed */
        objptr = objexp(mctx, objn, &need);
        p = objprp(objptr);
    }
    
    /* now build the index */
    indbase = objpfre(objptr);
    for (icnt = 0 ; cnt ; p = objpnxt(p), --cnt, ++icnt)
    {
        uint ofs = (uchar *)p - (uchar *)objptr;
        
        if (icnt)
        {
            /* figure out where to insert this property */
            first = 0;
            last = icnt - 1;
            for (;;)
            {
                if (first > last) break;
                cur = first + (last - first)/2;
                indp = indbase + cur*4;
                if (indp[0] == p[0] && indp[1] == p[1])
                    break;
                else if (indp[0] < p[0]
                         || (indp[0] == p[0] && indp[1] < p[1]))
                    first = (cur == first ? first + 1 : cur);
                else
                    last = (cur == last ? last - 1 : cur);
            }
            
            /* make sure we're positioned just before insertion point */
            while (cur < icnt
                   && (indp[0] <= p[0]
                       || (indp[0] == p[0] && indp[1] <= p[1])))
            {
                indp += 4;
                ++cur;
            }
                
            /* move elements above if any */
            if (cur < icnt)
                memmove(indp + 4, indp, (size_t)((icnt - cur) * 4));
        }
        else
            indp = indbase;
        
        /* insert property into index */
        indp[0] = p[0];
        indp[1] = p[1];
        oswp2(indp+2, ofs);
    }
    
    /* set the index flag, and dirty and free the object */
    objsflg(objptr, objflg(objptr) | OBJFINDEX);
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
}